

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void AddInlineVisibilityCompileOption
               (string *flags,cmGeneratorTarget *target,cmLocalGenerator *lg,string *warnCMP0063)

{
  bool bVar1;
  cmMakefile *this;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6d;
  undefined4 local_6c;
  bool prop;
  char *pcStack_68;
  char *opt;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string compileOption;
  string *warnCMP0063_local;
  cmLocalGenerator *lg_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  
  compileOption.field_2._8_8_ = warnCMP0063;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"CMAKE_CXX_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN",&local_49);
  std::allocator<char>::~allocator(&local_49);
  this = cmLocalGenerator::GetMakefile(lg);
  pcStack_68 = cmMakefile::GetDefinition(this,(string *)local_48);
  if (pcStack_68 == (char *)0x0) {
    local_6c = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"VISIBILITY_INLINES_HIDDEN",&local_91);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    local_6d = bVar1;
    if (bVar1) {
      if (compileOption.field_2._8_8_ == 0) {
        (*lg->_vptr_cmLocalGenerator[7])(lg,flags,pcStack_68);
        local_6c = 0;
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)compileOption.field_2._8_8_,"  VISIBILITY_INLINES_HIDDEN\n");
        local_6c = 1;
      }
    }
    else {
      local_6c = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

static void AddInlineVisibilityCompileOption(std::string& flags,
                                             cmGeneratorTarget const* target,
                                             cmLocalGenerator* lg,
                                             std::string* warnCMP0063)
{
  std::string compileOption =
    "CMAKE_CXX_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN";
  const char* opt = lg->GetMakefile()->GetDefinition(compileOption);
  if (!opt) {
    return;
  }

  bool prop = target->GetPropertyAsBool("VISIBILITY_INLINES_HIDDEN");
  if (!prop) {
    return;
  }
  if (warnCMP0063) {
    *warnCMP0063 += "  VISIBILITY_INLINES_HIDDEN\n";
    return;
  }
  lg->AppendFlags(flags, opt);
}